

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void send_negotiation(connectdata *conn,int cmd,int option)

{
  SessionHandle *data;
  ssize_t sVar1;
  uint *puVar2;
  uchar buf [3];
  undefined1 local_23 [3];
  
  data = conn->data;
  sVar1 = send(conn->sock[0],local_23,3,0x4000);
  if (sVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar2);
  }
  printoption(conn->data,"SENT",cmd,option);
  return;
}

Assistant:

static void send_negotiation(struct connectdata *conn, int cmd, int option)
{
   unsigned char buf[3];
   ssize_t bytes_written;
   int err;
   struct SessionHandle *data = conn->data;

   buf[0] = CURL_IAC;
   buf[1] = (unsigned char)cmd;
   buf[2] = (unsigned char)option;

   bytes_written = swrite(conn->sock[FIRSTSOCKET], buf, 3);
   if(bytes_written < 0) {
     err = SOCKERRNO;
     failf(data,"Sending data failed (%d)",err);
   }

   printoption(conn->data, "SENT", cmd, option);
}